

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

bool duckdb::NumericToHugeDecimalCast<signed_char>
               (char input,hugeint_t *result,CastParameters *parameters,uint8_t width,uint8_t scale)

{
  bool bVar1;
  long lVar2;
  undefined7 in_register_00000009;
  undefined7 in_register_00000081;
  uchar in_R9B;
  hugeint_t hVar3;
  hugeint_t hinput;
  string error;
  hugeint_t max_width;
  hugeint_t local_b8;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  string local_88;
  hugeint_t local_68;
  string local_50;
  
  lVar2 = ((CONCAT71(in_register_00000009,width) & 0xffffffff) -
          (CONCAT71(in_register_00000081,scale) & 0xffffffff)) * 0x10;
  local_68.lower = *(uint64_t *)(Hugeint::POWERS_OF_TEN + lVar2);
  local_68.upper = *(int64_t *)(Hugeint::POWERS_OF_TEN + lVar2 + 8);
  local_b8 = Hugeint::Convert<signed_char>(input);
  bVar1 = hugeint_t::operator>=(&local_b8,&local_68);
  if (!bVar1) {
    local_88._0_16_ = hugeint_t::operator-(&local_68);
    bVar1 = hugeint_t::operator<=(&local_b8,(hugeint_t *)&local_88);
    if (!bVar1) {
      hVar3 = hugeint_t::operator*
                        (&local_b8,
                         (hugeint_t *)
                         (Hugeint::POWERS_OF_TEN +
                         (uint)((int)CONCAT71(in_register_00000081,scale) << 4)));
      *result = hVar3;
      return true;
    }
  }
  local_a8[0] = local_98;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a8,"Could not cast value %s to DECIMAL(%d,%d)","");
  hugeint_t::ToString_abi_cxx11_(&local_50,&local_b8);
  StringUtil::Format<std::__cxx11::string,unsigned_char,unsigned_char>
            (&local_88,(StringUtil *)local_a8,&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)width,scale
             ,in_R9B);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0]);
  }
  HandleCastError::AssignError(&local_88,parameters);
  if ((hugeint_t *)local_88._M_dataplus._M_p != (hugeint_t *)&local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  return false;
}

Assistant:

bool NumericToHugeDecimalCast(SRC input, hugeint_t &result, CastParameters &parameters, uint8_t width, uint8_t scale) {
	// check for overflow
	hugeint_t max_width = Hugeint::POWERS_OF_TEN[width - scale];
	hugeint_t hinput = Hugeint::Convert(input);
	if (hinput >= max_width || hinput <= -max_width) {
		string error = StringUtil::Format("Could not cast value %s to DECIMAL(%d,%d)", hinput.ToString(), width, scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = hinput * Hugeint::POWERS_OF_TEN[scale];
	return true;
}